

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionHistory.h
# Opt level: O1

void __thiscall ActionHistory::Print(ActionHistory *this)

{
  long *local_28;
  long local_20;
  long local_18 [2];
  
  ActionHistory::SoftPrint_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_28,local_20);
  if (local_28 != local_18) {
    operator_delete(local_28,local_18[0] + 1);
  }
  return;
}

Assistant:

void Print() const
        { std::cout << SoftPrint();}